

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
                *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
          ::hasFastAccess((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                           *)0x157d0ba);
  local_9 = false;
  if (bVar1) {
    local_9 = FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              ::hasFastAccess((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                               *)0x157d0d6);
  }
  return local_9;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}